

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.h
# Opt level: O0

NameArguments<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
Console::
NameArguments<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::get(NameArguments<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *argumentNames,uint nextName,uint requiredArguments)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  NameArguments<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  string local_90 [32];
  string local_70 [48];
  string local_40 [8];
  string nameT;
  uint requiredArguments_local;
  uint nextName_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argumentNames_local;
  
  std::__cxx11::string::string(local_40);
  bVar1 = std::type_info::operator==
                    ((type_info *)&std::__cxx11::string::typeinfo,(type_info *)&int::typeinfo);
  if (bVar1) {
    std::__cxx11::string::operator=(local_40,"<int");
  }
  else {
    bVar1 = std::type_info::operator==
                      ((type_info *)&std::__cxx11::string::typeinfo,(type_info *)&float::typeinfo);
    if (bVar1) {
      std::__cxx11::string::operator=(local_40,"<float");
    }
    else {
      bVar1 = std::type_info::operator==
                        ((type_info *)&std::__cxx11::string::typeinfo,
                         (type_info *)&std::__cxx11::string::typeinfo);
      if (bVar1) {
        std::__cxx11::string::operator=(local_40,"<string");
      }
      else {
        std::__cxx11::string::operator=(local_40,"<???");
      }
    }
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(argumentNames);
  if (nextName < sVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](argumentNames,(ulong)nextName);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](argumentNames,(ulong)nextName);
      std::operator+((char *)local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12b2b8);
      std::__cxx11::string::operator+=(local_40,local_70);
      std::__cxx11::string::~string(local_70);
    }
  }
  std::__cxx11::string::operator+=(local_40,">");
  if (nextName == requiredArguments) {
    std::operator+((char *)local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[");
    std::__cxx11::string::operator=(local_40,local_90);
    std::__cxx11::string::~string(local_90);
  }
  std::operator+((char *)local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12b2b8);
  NameArguments<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  get(local_d0,argumentNames,nextName + 1,requiredArguments);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,local_b0)
  ;
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string(local_40);
  return this;
}

Assistant:

static inline std::string get(const std::vector<std::string> &argumentNames, unsigned int nextName, unsigned int requiredArguments) {
        std::string nameT;
        if (typeid(T) == typeid(int)) {
            nameT = "<int";
        }
        else if (typeid(T) == typeid(float)) {
            nameT = "<float";
        }
        else if (typeid(T) == typeid(std::string)) {
            nameT = "<string";
        }
        else {
            nameT = "<???";
        }
        if (argumentNames.size() > nextName && !argumentNames[nextName].empty()) {
            nameT += " " + argumentNames[nextName];
        }
        nameT += ">";

        if (nextName == requiredArguments) {
            nameT = "[" + nameT;
        }

        return " " + nameT + NameArguments<Args...>::get(argumentNames, nextName + 1, requiredArguments);
    }